

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringconverter.cpp
# Opt level: O0

QByteArray * QUtf8::convertFromUnicode(QStringView in,State *state)

{
  char *pcVar1;
  char *pcVar2;
  __off_t __length;
  QByteArray *in_RDI;
  long in_FS_OFFSET;
  char *end;
  QByteArray *ba;
  State *in_stack_00000380;
  QStringView in_stack_00000388;
  Initialization in_stack_ffffffffffffff9c;
  QByteArray *this;
  QByteArray *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 uVar3;
  QStringView local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = 0;
  (in_RDI->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (char *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->d).size = -0x5555555555555556;
  this = in_RDI;
  QStringView::size(&local_18);
  QByteArray::QByteArray(in_stack_ffffffffffffffa8,(qsizetype)this,in_stack_ffffffffffffff9c);
  QByteArray::data(this);
  pcVar1 = convertFromUnicode((char *)CONCAT17(uVar3,in_stack_ffffffffffffffc0),in_stack_00000388,
                              in_stack_00000380);
  pcVar2 = QByteArray::data(this);
  QByteArray::truncate(in_RDI,pcVar1 + -(long)pcVar2,__length);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return this;
}

Assistant:

QByteArray QUtf8::convertFromUnicode(QStringView in, QStringConverter::State *state)
{
    QByteArray ba(3*in.size() +3, Qt::Uninitialized);
    char *end = convertFromUnicode(ba.data(), in, state);
    ba.truncate(end - ba.data());
    return ba;
}